

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void done_gesture_proc(Am_Object *cmd)

{
  ushort uVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object local_c8;
  Am_String local_c0;
  Am_Object local_b8;
  Am_Object cls_1;
  Am_Value_List l;
  Am_Object local_a0;
  Am_String local_98;
  Am_String recognized;
  Am_Object local_88;
  Am_Object example;
  Am_String local_78;
  byte local_69;
  Am_Value_List local_68 [7];
  bool new_list;
  Am_Value_List examples;
  Am_String local_58;
  Am_String class_name;
  Am_Object cls;
  Am_Feature_Vector local_40 [8];
  Am_Feature_Vector feat;
  undefined1 local_28 [8];
  Am_Point_List pl;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&pl.item,(Am_Slot_Flags)cmd);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&pl.item,0xb2);
  Am_Point_List::Am_Point_List((Am_Point_List *)local_28,pAVar3);
  Am_Feature_Vector::Am_Feature_Vector(local_40,(Am_Point_List *)local_28);
  pAVar3 = (Am_Value *)Am_Object::Get(0x5560,0x169);
  Am_String::Am_String((Am_String *)&cls,pAVar3);
  bVar2 = Am_String::operator==((Am_String *)&cls,(Am_String *)&training_mode);
  Am_String::~Am_String((Am_String *)&cls);
  if ((bVar2 & 1) == 0) {
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
    Am_String::Am_String(&local_98,pAVar3);
    bVar2 = Am_String::Valid();
    if ((bVar2 & 1) == 0) {
      Am_Object::Am_Object(&local_a0,(Am_Object *)&Am_No_Object);
      Am_Beep((Am_Object *)&local_a0);
      Am_Object::~Am_Object(&local_a0);
      Am_Object::Set(0x5510,0x169,0);
    }
    else {
      pAVar3 = (Am_Value *)Am_Object::Get(0x5510,0xa2);
      Am_Value_List::Am_Value_List((Am_Value_List *)&cls_1,pAVar3);
      Am_Value_List::Start();
      while (bVar2 = Am_Value_List::Last(), ((bVar2 ^ 0xff) & 1) != 0) {
        pAVar3 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object(&local_b8,pAVar3);
        pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_b8,(ulong)(ushort)CLASS_NAME);
        Am_String::Am_String(&local_c0,pAVar3);
        bVar2 = Am_String::operator==(&local_c0,(Am_String *)&local_98);
        Am_String::~Am_String(&local_c0);
        if ((bVar2 & 1) != 0) {
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_b8);
          Am_Object::Set(0x5510,(Am_Wrapper *)0x169,(ulong)pAVar4);
          Am_Object::Get_Owner(&local_c8,(Am_Slot_Flags)&local_b8);
          scroll_into_view(&local_c8);
          Am_Object::~Am_Object(&local_c8);
        }
        Am_Object::~Am_Object(&local_b8);
        Am_Value_List::Next();
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)&cls_1);
    }
    Am_Object::Set(0x5530,0x169,0);
    Am_String::~Am_String(&local_98);
  }
  else {
    pAVar3 = (Am_Value *)Am_Object::Get(0x5510,0x169);
    Am_Object::Am_Object((Am_Object *)&class_name,pAVar3);
    bVar2 = Am_Object::Valid();
    if ((bVar2 & 1) != 0) {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&class_name,(ulong)(ushort)CLASS_NAME);
      Am_String::Am_String(&local_58,pAVar3);
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&class_name,(ulong)(ushort)CLASS_EXAMPLES);
      Am_Value_List::Am_Value_List(local_68,pAVar3);
      local_69 = Am_Value_List::Empty();
      local_69 = local_69 & 1;
      Am_String::Am_String(&local_78,(Am_String *)&local_58);
      Am_Feature_Vector::Am_Feature_Vector((Am_Feature_Vector *)&example,local_40);
      Am_Gesture_Trainer::Add_Example(&trainer,&local_78,&example,1);
      Am_Feature_Vector::~Am_Feature_Vector((Am_Feature_Vector *)&example);
      Am_String::~Am_String(&local_78);
      Am_Feature_Vector::Am_Feature_Vector((Am_Feature_Vector *)&recognized,local_40);
      Example_Create((Am_Feature_Vector *)&local_88);
      Am_Feature_Vector::~Am_Feature_Vector((Am_Feature_Vector *)&recognized);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_88);
      Am_Value_List::Add((Am_Wrapper *)local_68,(Am_Add_Position)pAVar4,true);
      uVar1 = (ushort)CLASS_EXAMPLES;
      if ((local_69 & 1) == 0) {
        Am_Object::Note_Changed((ushort)&class_name);
      }
      else {
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_68);
        Am_Object::Set((ushort)&class_name,(Am_Wrapper *)(ulong)uVar1,(ulong)pAVar4);
      }
      dirty = true;
      Am_Object::~Am_Object(&local_88);
      Am_Value_List::~Am_Value_List(local_68);
      Am_String::~Am_String(&local_58);
    }
    Am_Object::~Am_Object((Am_Object *)&class_name);
  }
  Am_Feature_Vector::~Am_Feature_Vector(local_40);
  Am_Point_List::~Am_Point_List((Am_Point_List *)local_28);
  Am_Object::~Am_Object((Am_Object *)&pl.item);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, done_gesture, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Point_List pl = inter.Get(Am_POINT_LIST);
  Am_Feature_Vector feat(pl);

  if (Am_String(mode.Get(Am_VALUE)) == training_mode) {
    Am_Object cls = class_panel.Get(Am_VALUE);
    if (cls.Valid()) {
      Am_String class_name = cls.Get(CLASS_NAME);
      Am_Value_List examples = cls.Get(CLASS_EXAMPLES);
      bool new_list = examples.Empty();

      trainer.Add_Example(class_name, feat);

      Am_Object example = Example_Create(feat);
      examples.Add(example, Am_TAIL, false);
      if (new_list)
        cls.Set(CLASS_EXAMPLES, examples);
      else
        cls.Note_Changed(CLASS_EXAMPLES);

      // select it?
      // example_panel.Set (Am_VALUE, example);

      // the classifier has changed, so set dirty flag
      dirty = true;
    }
  }

  else {
    // search for recognized class and select it
    Am_String recognized = cmd.Get(Am_VALUE);

    if (!recognized.Valid()) {
      // unrecognized!
      Am_Beep();
      class_panel.Set(Am_VALUE, 0);
    } else {
      // search for recognized class name
      Am_Value_List l = class_panel.Get(Am_ITEMS);
      for (l.Start(); !l.Last(); l.Next()) {
        Am_Object cls = l.Get();
        if (Am_String(cls.Get(CLASS_NAME)) == recognized) {
          class_panel.Set(Am_VALUE, cls);
          scroll_into_view(cls.Get_Owner());
        }
      }
    }
    example_panel.Set(Am_VALUE, 0);
  }
}